

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Bool prvTidyattrIsEvent(AttVal *attval)

{
  bool local_19;
  TidyAttrId local_18;
  TidyAttrId atid;
  AttVal *attval_local;
  
  if ((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) {
    local_18 = TidyAttr_UNKNOWN;
  }
  else {
    local_18 = attval->dict->id;
  }
  local_19 = true;
  if (((((((((local_18 != TidyAttr_OnAFTERUPDATE) &&
            (local_19 = true, local_18 != TidyAttr_OnBEFOREUNLOAD)) &&
           (local_19 = true, local_18 != TidyAttr_OnBEFOREUPDATE)) &&
          ((local_19 = true, local_18 != TidyAttr_OnBLUR &&
           (local_19 = true, local_18 != TidyAttr_OnCHANGE)))) &&
         (local_19 = true, local_18 != TidyAttr_OnCLICK)) &&
        (((local_19 = true, local_18 != TidyAttr_OnDATAAVAILABLE &&
          (local_19 = true, local_18 != TidyAttr_OnDATASETCHANGED)) &&
         ((local_19 = true, local_18 != TidyAttr_OnDATASETCOMPLETE &&
          (((local_19 = true, local_18 != TidyAttr_OnDBLCLICK &&
            (local_19 = true, local_18 != TidyAttr_OnERRORUPDATE)) &&
           (local_19 = true, local_18 != TidyAttr_OnFOCUS)))))))) &&
       ((local_19 = true, local_18 != TidyAttr_OnKEYDOWN &&
        (local_19 = true, local_18 != TidyAttr_OnKEYPRESS)))) &&
      (((local_19 = true, local_18 != TidyAttr_OnKEYUP &&
        (((local_19 = true, local_18 != TidyAttr_OnLOAD &&
          (local_19 = true, local_18 != TidyAttr_OnMOUSEDOWN)) &&
         ((local_19 = true, local_18 != TidyAttr_OnMOUSEMOVE &&
          (((local_19 = true, local_18 != TidyAttr_OnMOUSEOUT &&
            (local_19 = true, local_18 != TidyAttr_OnMOUSEOVER)) &&
           (local_19 = true, local_18 != TidyAttr_OnMOUSEUP)))))))) &&
       (((local_19 = true, local_18 != TidyAttr_OnRESET &&
         (local_19 = true, local_18 != TidyAttr_OnROWENTER)) &&
        (local_19 = true, local_18 != TidyAttr_OnROWEXIT)))))) &&
     ((local_19 = true, local_18 != TidyAttr_OnSELECT &&
      (local_19 = true, local_18 != TidyAttr_OnSUBMIT)))) {
    local_19 = local_18 == TidyAttr_OnUNLOAD;
  }
  return (Bool)local_19;
}

Assistant:

Bool TY_(attrIsEvent)( AttVal* attval )
{
    TidyAttrId atid = AttrId( attval );

    return (atid == TidyAttr_OnAFTERUPDATE     ||
            atid == TidyAttr_OnBEFOREUNLOAD    ||
            atid == TidyAttr_OnBEFOREUPDATE    ||
            atid == TidyAttr_OnBLUR            ||
            atid == TidyAttr_OnCHANGE          ||
            atid == TidyAttr_OnCLICK           ||
            atid == TidyAttr_OnDATAAVAILABLE   ||
            atid == TidyAttr_OnDATASETCHANGED  ||
            atid == TidyAttr_OnDATASETCOMPLETE ||
            atid == TidyAttr_OnDBLCLICK        ||
            atid == TidyAttr_OnERRORUPDATE     ||
            atid == TidyAttr_OnFOCUS           ||
            atid == TidyAttr_OnKEYDOWN         ||
            atid == TidyAttr_OnKEYPRESS        ||
            atid == TidyAttr_OnKEYUP           ||
            atid == TidyAttr_OnLOAD            ||
            atid == TidyAttr_OnMOUSEDOWN       ||
            atid == TidyAttr_OnMOUSEMOVE       ||
            atid == TidyAttr_OnMOUSEOUT        ||
            atid == TidyAttr_OnMOUSEOVER       ||
            atid == TidyAttr_OnMOUSEUP         ||
            atid == TidyAttr_OnRESET           ||
            atid == TidyAttr_OnROWENTER        ||
            atid == TidyAttr_OnROWEXIT         ||
            atid == TidyAttr_OnSELECT          ||
            atid == TidyAttr_OnSUBMIT          ||
            atid == TidyAttr_OnUNLOAD);
}